

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

bool __thiscall
cmUVProcessChain::InternalData::AddCommand
          (InternalData *this,ProcessConfiguration *config,bool first,bool last)

{
  ProcessData *data;
  pointer pbVar1;
  pointer puVar2;
  uv_exit_cb p_Var3;
  int iVar4;
  uv_loop_t *puVar5;
  ulong uVar6;
  const_iterator __begin1;
  pointer pbVar7;
  bool bVar8;
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  array<uv_stdio_container_s,_3UL> stdio;
  uv_process_options_t options;
  char **local_d8;
  undefined8 uStack_d0;
  long local_c8;
  uv_stdio_container_t local_b8;
  undefined8 local_a8;
  anon_union_8_2_26168aa3_for_data aStack_a0;
  undefined8 local_98;
  anon_union_8_2_26168aa3_for_data aStack_90;
  uv_process_options_t local_88;
  
  local_88.exit_cb = (uv_exit_cb)operator_new(0x40);
  *(undefined8 *)local_88.exit_cb = 0;
  *(undefined8 *)(local_88.exit_cb + 8) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x10) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x18) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x20) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x28) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x30) = 0;
  *(undefined8 *)(local_88.exit_cb + 0x38) = 0;
  std::
  vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
  ::
  emplace_back<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>
            ((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
              *)&this->Processes,
             (unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
              *)&local_88);
  p_Var3 = local_88.exit_cb;
  if (local_88.exit_cb != (uv_exit_cb)0x0) {
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)(local_88.exit_cb + 0x18));
    ::cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_process_s> *)(p_Var3 + 8));
    operator_delete(p_Var3,0x40);
  }
  data = (this->Processes).
         super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
         .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>._M_head_impl;
  data->Data = this;
  local_88.cpumask = (char *)0x0;
  local_88.cpumask_size = 0;
  local_88.stdio = (uv_stdio_container_t *)0x0;
  local_88.uid = 0;
  local_88.gid = 0;
  local_88.cwd = (char *)0x0;
  local_88.flags = 0;
  local_88.stdio_count = 0;
  local_88.args = (char **)0x0;
  local_88.env = (char **)0x0;
  local_88.exit_cb = (uv_exit_cb)0x0;
  pbVar7 = (config->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.file = (pbVar7->_M_dataplus)._M_p;
  local_d8 = (char **)0x0;
  uStack_d0 = 0;
  local_c8 = 0;
  pbVar1 = (config->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar1) {
    do {
      local_b8._0_8_ = (pbVar7->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_b8);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar1);
  }
  local_b8._0_8_ = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_b8);
  local_88.args = local_d8;
  local_88.flags = 0x10;
  local_b8._0_8_ = (char *)0x0;
  local_b8.data.stream = (uv_stream_t *)0x0;
  if (first) {
    local_b8._0_8_ = (char *)0x0;
  }
  else {
    puVar2 = (this->Processes).
             super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->Processes).
                  super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (uVar6 < 9) {
      __assert_fail("this->Processes.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmUVProcessChain.cxx"
                    ,0xff,
                    "bool cmUVProcessChain::InternalData::AddCommand(const cmUVProcessChainBuilder::ProcessConfiguration &, bool, bool)"
                   );
    }
    local_b8._0_8_ = (char *)0x4;
    local_b8.data.stream =
         ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                   ((uv_pipe_ptr *)(*(long *)((long)puVar2 + (uVar6 - 0x10)) + 0x18));
  }
  if (last) {
    local_a8 = *(undefined8 *)&(this->OutputStreamData).super_BasicStreamData.Stdio;
    aStack_a0 = (this->OutputStreamData).super_BasicStreamData.Stdio.data;
  }
  else {
    puVar5 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    iVar4 = ::cm::uv_pipe_ptr::init(&data->OutputPipe,(EVP_PKEY_CTX *)puVar5);
    if (iVar4 < 0) {
      bVar8 = false;
      goto LAB_003981bb;
    }
    local_a8 = 0x21;
    aStack_a0.stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&data->OutputPipe);
  }
  local_98 = *(undefined8 *)&(this->ErrorStreamData).super_BasicStreamData.Stdio;
  aStack_90 = (this->ErrorStreamData).super_BasicStreamData.Stdio.data;
  local_88.stdio_count = 3;
  local_88.exit_cb = AddCommand::anon_class_1_0_00000001::__invoke;
  local_88.stdio = &local_b8;
  puVar5 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
  iVar4 = ::cm::uv_process_ptr::spawn(&data->Process,puVar5,&local_88,data);
  bVar8 = -1 < iVar4;
LAB_003981bb:
  if (local_d8 != (char **)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  return bVar8;
}

Assistant:

bool cmUVProcessChain::InternalData::AddCommand(
  const cmUVProcessChainBuilder::ProcessConfiguration& config, bool first,
  bool last)
{
  this->Processes.emplace_back(cm::make_unique<ProcessData>());
  auto& process = *this->Processes.back();
  process.Data = this;

  auto options = uv_process_options_t();

  // Bounds were checked at add time, first element is guaranteed to exist
  options.file = config.Arguments[0].c_str();

  std::vector<const char*> arguments;
  for (auto const& arg : config.Arguments) {
    arguments.push_back(arg.c_str());
  }
  arguments.push_back(nullptr);
  options.args = const_cast<char**>(arguments.data());
  options.flags = UV_PROCESS_WINDOWS_HIDE;

  std::array<uv_stdio_container_t, 3> stdio;
  stdio[0] = uv_stdio_container_t();
  if (first) {
    stdio[0].flags = UV_IGNORE;
  } else {
    assert(this->Processes.size() >= 2);
    auto& prev = *this->Processes[this->Processes.size() - 2];
    stdio[0].flags = UV_INHERIT_STREAM;
    stdio[0].data.stream = prev.OutputPipe;
  }
  if (last) {
    stdio[1] = this->OutputStreamData.Stdio;
  } else {
    if (process.OutputPipe.init(*this->Loop, 0) < 0) {
      return false;
    }
    stdio[1] = uv_stdio_container_t();
    stdio[1].flags =
      static_cast<uv_stdio_flags>(UV_CREATE_PIPE | UV_WRITABLE_PIPE);
    stdio[1].data.stream = process.OutputPipe;
  }
  stdio[2] = this->ErrorStreamData.Stdio;

  options.stdio = stdio.data();
  options.stdio_count = 3;
  options.exit_cb = [](uv_process_t* handle, int64_t exitStatus,
                       int termSignal) {
    auto* processData = static_cast<ProcessData*>(handle->data);
    processData->Finished = true;
    processData->ProcessStatus.ExitStatus = exitStatus;
    processData->ProcessStatus.TermSignal = termSignal;
    processData->Data->ProcessesCompleted++;
  };

  return process.Process.spawn(*this->Loop, options, &process) >= 0;
}